

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void pgetrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  byte *pbVar5;
  uint extraout_EDX;
  uint extraout_EDX_00;
  long extraout_RDX;
  ulong unaff_RBX;
  char *unaff_RBP;
  byte *pbVar6;
  undefined1 *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte *__buf;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  float __x;
  uchar c;
  undefined1 uStack_11d;
  uint uStack_11c;
  ulong uStack_118;
  long lStack_110;
  ulong uStack_108;
  ulong uStack_100;
  byte *pbStack_f8;
  long lStack_f0;
  byte *pbStack_e8;
  code *pcStack_e0;
  byte bStack_d5;
  uint uStack_d4;
  byte *pbStack_d0;
  long lStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  byte *pbStack_b0;
  byte *pbStack_a8;
  byte *pbStack_a0;
  code *pcStack_98;
  byte bStack_8d;
  uint uStack_8c;
  byte *pbStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  pbVar6 = (byte *)(ulong)(uint)sx;
  uVar9 = (ulong)(uint)r;
  pbVar5 = (byte *)(ulong)(uint)sy;
  pbVar12 = (byte *)0x0;
  pcStack_50 = (code *)0x102a70;
  uVar8 = sy;
  uVar3 = r;
  local_44 = sx;
  uVar1 = open(fn,0);
  pbVar15 = pbVar5;
  if ((int)uVar1 < 1) {
LAB_00102b1a:
    pcStack_50 = (code *)0x102b1f;
    pgetrast_cold_1();
  }
  else {
    unaff_RBP = (char *)(ulong)uVar1;
    fn = (char *)(ulong)uVar1;
    pcStack_50 = (code *)0x102a89;
    pbVar12 = hd;
    sVar4 = read(uVar1,hd,0x20);
    if (sVar4 == 0x20) {
      if (0 < sy) {
        unaff_RBX = (ulong)local_44;
        local_38 = (long)r << 2;
        hd = (byte *)0x0;
        pbVar15 = &local_45;
        pbVar6 = pbVar5;
        local_40 = pbVar5;
        do {
          if (0 < (int)local_44) {
            uVar9 = 0;
            do {
              pcStack_50 = (code *)0x102ad1;
              pbVar12 = pbVar15;
              fn = unaff_RBP;
              sVar4 = read(uVar1,pbVar15,1);
              if (sVar4 != 1) {
                pcStack_50 = (code *)0x102b1a;
                pgetrast_cold_3();
                goto LAB_00102b1a;
              }
              bf[uVar9] = (float)local_45;
              uVar9 = uVar9 + 1;
            } while (unaff_RBX != uVar9);
          }
          hd = hd + 1;
          bf = (float *)((long)bf + local_38);
        } while (hd != local_40);
      }
      close(uVar1);
      return;
    }
  }
  pcStack_50 = Bpgetrast;
  pgetrast_cold_2();
  uVar10 = (ulong)uVar8;
  pbVar14 = (byte *)((ulong)pbVar6 & 0xffffffff);
  __buf = (byte *)0x0;
  pcStack_98 = (code *)0x102b48;
  pbVar5 = pbVar6;
  uVar1 = uVar8;
  uStack_8c = extraout_EDX;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar9;
  pbStack_68 = hd;
  pfStack_60 = bf;
  pbStack_58 = pbVar15;
  pcStack_50 = (code *)unaff_RBP;
  uVar2 = open(fn,0);
  pbVar15 = pbVar14;
  if (0 < (int)uVar2) {
    unaff_RBP = (char *)(ulong)uVar2;
    if (0 < (int)pbVar6) {
      unaff_RBX = (ulong)uStack_8c;
      lStack_80 = (long)(int)uVar8 << 2;
      hd = (byte *)0x0;
      pbVar15 = &bStack_8d;
      pbVar5 = pbVar14;
      pbStack_88 = pbVar14;
      do {
        if (0 < (int)uStack_8c) {
          uVar10 = 0;
          do {
            pcStack_98 = (code *)0x102b90;
            __buf = pbVar15;
            fn = unaff_RBP;
            sVar4 = read(uVar2,pbVar15,1);
            if (sVar4 != 1) {
              pcStack_98 = (code *)0x102bd9;
              Bpgetrast_cold_2();
              goto LAB_00102bd9;
            }
            *(float *)(pbVar12 + uVar10 * 4) = (float)bStack_8d;
            uVar10 = uVar10 + 1;
          } while (unaff_RBX != uVar10);
        }
        hd = hd + 1;
        pbVar12 = pbVar12 + lStack_80;
      } while (hd != pbStack_88);
    }
    close(uVar2);
    return;
  }
LAB_00102bd9:
  pcStack_98 = pputrast;
  Bpgetrast_cold_1();
  uVar9 = (ulong)uVar3;
  pbVar14 = (byte *)(ulong)uVar1;
  uStack_d4 = (uint)pbVar5;
  pbVar6 = (byte *)0x180;
  pcStack_e0 = (code *)0x102c06;
  uVar8 = uVar1;
  uStack_c0 = unaff_RBX;
  uStack_b8 = uVar10;
  pbStack_b0 = hd;
  pbStack_a8 = pbVar12;
  pbStack_a0 = pbVar15;
  pcStack_98 = (code *)unaff_RBP;
  uVar2 = creat(fn,0x180);
  lVar13 = extraout_RDX;
  pbVar15 = pbVar14;
  if ((int)uVar2 < 1) {
LAB_00102ca8:
    pcStack_e0 = (code *)0x102cad;
    pputrast_cold_1();
  }
  else {
    unaff_RBP = (char *)(ulong)uVar2;
    fn = (char *)(ulong)uVar2;
    pcStack_e0 = (code *)0x102c1f;
    pbVar6 = __buf;
    sVar4 = write(uVar2,__buf,0x20);
    if (sVar4 == 0x20) {
      if (0 < (int)uVar1) {
        unaff_RBX = (ulong)uStack_d4;
        lStack_c8 = (long)(int)uVar3 << 2;
        __buf = (byte *)0x0;
        pbVar15 = &bStack_d5;
        pbVar5 = pbVar14;
        pbStack_d0 = pbVar14;
        do {
          if (0 < (int)uStack_d4) {
            uVar9 = 0;
            do {
              bStack_d5 = (byte)(int)*(float *)(lVar13 + uVar9 * 4);
              pcStack_e0 = (code *)0x102c71;
              pbVar6 = pbVar15;
              fn = unaff_RBP;
              sVar4 = write(uVar2,pbVar15,1);
              if (sVar4 != 1) {
                pcStack_e0 = (code *)0x102ca8;
                pputrast_cold_3();
                goto LAB_00102ca8;
              }
              uVar9 = uVar9 + 1;
            } while (unaff_RBX != uVar9);
          }
          __buf = __buf + 1;
          lVar13 = lVar13 + lStack_c8;
        } while (__buf != pbStack_d0);
      }
      close(uVar2);
      return;
    }
  }
  pcStack_e0 = Bpputrast;
  pputrast_cold_2();
  uVar1 = 0x180;
  uStack_11c = extraout_EDX_00;
  uStack_108 = unaff_RBX;
  uStack_100 = uVar9;
  pbStack_f8 = __buf;
  lStack_f0 = lVar13;
  pbStack_e8 = pbVar15;
  pcStack_e0 = (code *)unaff_RBP;
  uVar3 = creat(fn,0x180);
  if (0 < (int)uVar3) {
    if (0 < (int)pbVar5) {
      uVar9 = (ulong)uStack_11c;
      lStack_110 = (long)(int)uVar8 << 2;
      uVar10 = 0;
      uStack_118 = (ulong)pbVar5 & 0xffffffff;
      do {
        if (0 < (int)uStack_11c) {
          uVar11 = 0;
          do {
            uStack_11d = (undefined1)(int)*(float *)(pbVar6 + uVar11 * 4);
            fn = (char *)(ulong)uVar3;
            puVar7 = &uStack_11d;
            sVar4 = write(uVar3,&uStack_11d,1);
            uVar1 = (uint)puVar7;
            if (sVar4 != 1) {
              Bpputrast_cold_2();
              goto LAB_00102d60;
            }
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        uVar10 = uVar10 + 1;
        pbVar6 = pbVar6 + lStack_110;
      } while (uVar10 != uStack_118);
    }
    close(uVar3);
    return;
  }
LAB_00102d60:
  Bpputrast_cold_1();
  __x = 0.0;
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      __x = __x + *(float *)(fn + uVar9 * 4) * *(float *)(fn + uVar9 * 4);
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  if (0.0 <= __x) {
    return;
  }
  sqrtf(__x);
  return;
}

Assistant:

void pgetrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    if (read(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          if (read(fd,&c,sizeof(c)) != 1) {
            error(4) ;
          }
          bf[r*i + j] = (float)c ;
        }
      }
    }
    else {
      error(5) ;
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}